

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O1

void deqp::ub::anon_unknown_1::generateValueSrc
               (ostringstream *src,UniformLayoutEntry *entry,void *basePtr,int elementNdx)

{
  DataType dataType;
  long lVar1;
  DataType DVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  ostringstream *poVar8;
  int precision;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar9;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  ulong uVar10;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  string local_60;
  ostringstream *local_40;
  int local_38;
  int local_34;
  
  DVar2 = glu::getDataTypeScalarType(entry->type);
  uVar3 = glu::getDataTypeScalarSize(entry->type);
  iVar4 = entry->offset;
  iVar14 = 0;
  if (1 < entry->size) {
    iVar14 = elementNdx * entry->arrayStride;
  }
  uVar9 = extraout_RDX;
  if (1 < (int)uVar3) {
    pcVar5 = glu::getDataTypeName(entry->type);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)src +
                      (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,"(",1);
    uVar9 = extraout_RDX_00;
  }
  lVar1 = (long)iVar14 + (long)iVar4;
  dataType = entry->type;
  local_40 = src;
  if (dataType - TYPE_DOUBLE_MAT2 < 9 || dataType - TYPE_FLOAT_MAT2 < 9) {
    iVar4 = glu::getDataTypeMatrixNumRows(dataType);
    local_38 = glu::getDataTypeMatrixNumColumns(entry->type);
    poVar8 = local_40;
    if (0 < local_38) {
      iVar14 = 0;
      uVar9 = extraout_RDX_01;
      do {
        if (0 < iVar4) {
          local_34 = iVar14 * 4;
          iVar15 = 0;
          iVar11 = 0;
          do {
            precision = (int)uVar9;
            if (entry->isRowMajor == true) {
              iVar12 = entry->matrixStride * iVar11 + local_34;
            }
            else {
              iVar12 = entry->matrixStride * iVar14 + iVar15;
            }
            if (iVar14 != 0 || iVar11 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
              precision = extraout_EDX;
            }
            de::floatToString_abi_cxx11_
                      (&local_60,(de *)&DAT_00000001,*(float *)((long)basePtr + iVar12 + lVar1),
                       precision);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,
                       local_60._M_dataplus._M_p,local_60._M_string_length);
            uVar9 = extraout_RDX_02;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
              uVar9 = extraout_RDX_03;
            }
            iVar11 = iVar11 + 1;
            iVar15 = iVar15 + 4;
          } while (iVar4 != iVar11);
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != local_38);
    }
  }
  else if (0 < (int)uVar3) {
    lVar13 = 0;
    do {
      if (lVar13 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        uVar9 = extraout_RDX_04;
      }
      lVar7 = (long)(int)lVar13;
      if ((int)DVar2 < 0x1f) {
        if (DVar2 == TYPE_FLOAT) {
          de::floatToString_abi_cxx11_
                    (&local_60,(de *)&DAT_00000001,*(float *)((long)basePtr + lVar7 + lVar1),
                     (int)uVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&src->super_basic_ostream<char,_std::char_traits<char>_>,
                     local_60._M_dataplus._M_p,local_60._M_string_length);
          uVar9 = extraout_RDX_06;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            uVar9 = extraout_RDX_07;
          }
        }
        else if (DVar2 == TYPE_INT) {
          std::ostream::operator<<(src,*(int *)((long)basePtr + lVar7 + lVar1));
          uVar9 = extraout_RDX_05;
        }
      }
      else {
        if (DVar2 == TYPE_UINT) {
          poVar8 = (ostringstream *)std::ostream::_M_insert<unsigned_long>((ulong)src);
          uVar10 = 1;
          pcVar5 = "u";
        }
        else {
          if (DVar2 != TYPE_BOOL) goto LAB_00df88b5;
          bVar16 = *(int *)((long)basePtr + lVar7 + lVar1) == 0;
          pcVar5 = "true";
          if (bVar16) {
            pcVar5 = "false";
          }
          uVar10 = (ulong)bVar16 | 4;
          poVar8 = src;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5,uVar10);
        uVar9 = extraout_RDX_08;
      }
LAB_00df88b5:
      lVar13 = lVar13 + 4;
    } while ((ulong)uVar3 << 2 != lVar13);
  }
  if (1 < (int)uVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_40->super_basic_ostream<char,_std::char_traits<char>_>,")",1);
  }
  return;
}

Assistant:

void generateValueSrc(std::ostringstream& src, const UniformLayoutEntry& entry, const void* basePtr, int elementNdx)
{
	glu::DataType  scalarType = glu::getDataTypeScalarType(entry.type);
	int			   scalarSize = glu::getDataTypeScalarSize(entry.type);
	bool		   isArray	= entry.size > 1;
	const deUint8* elemPtr	= (const deUint8*)basePtr + entry.offset + (isArray ? elementNdx * entry.arrayStride : 0);
	const int	  compSize   = sizeof(deUint32);

	if (scalarSize > 1)
		src << glu::getDataTypeName(entry.type) << "(";

	if (glu::isDataTypeMatrix(entry.type))
	{
		int numRows = glu::getDataTypeMatrixNumRows(entry.type);
		int numCols = glu::getDataTypeMatrixNumColumns(entry.type);

		DE_ASSERT(scalarType == glu::TYPE_FLOAT);

		// Constructed in column-wise order.
		for (int colNdx = 0; colNdx < numCols; colNdx++)
		{
			for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
			{
				const deUint8* compPtr = elemPtr + (entry.isRowMajor ? rowNdx * entry.matrixStride + colNdx * compSize :
																	   colNdx * entry.matrixStride + rowNdx * compSize);

				if (colNdx > 0 || rowNdx > 0)
					src << ", ";

				src << de::floatToString(*((const float*)compPtr), 1);
			}
		}
	}
	else
	{
		for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
		{
			const deUint8* compPtr = elemPtr + scalarNdx * compSize;

			if (scalarNdx > 0)
				src << ", ";

			switch (scalarType)
			{
			case glu::TYPE_FLOAT:
				src << de::floatToString(*((const float*)compPtr), 1);
				break;
			case glu::TYPE_INT:
				src << *((const int*)compPtr);
				break;
			case glu::TYPE_UINT:
				src << *((const deUint32*)compPtr) << "u";
				break;
			case glu::TYPE_BOOL:
				src << (*((const deUint32*)compPtr) != 0u ? "true" : "false");
				break;
			default:
				DE_ASSERT(false);
			}
		}
	}

	if (scalarSize > 1)
		src << ")";
}